

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O2

void __thiscall
icu_63::ExtraData::writeCompositions(ExtraData *this,UChar32 c,Norm *norm,UnicodeString *dataString)

{
  int c_00;
  UVector32 *pUVar1;
  char16_t cVar2;
  Norm *pNVar3;
  UnicodeString *this_00;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  char16_t srcChar;
  uint uVar7;
  ulong uVar8;
  int32_t *local_50;
  
  if (norm->cc != '\0') {
    fprintf(_stderr,
            "gennorm2 error: U+%04lX combines-forward and has ccc!=0, not possible in Unicode normalization\n"
            ,(long)c);
    exit(3);
  }
  pUVar1 = norm->compositions;
  uVar8 = 0;
  if (pUVar1 == (UVector32 *)0x0) {
    uVar4 = 0;
    local_50 = (int32_t *)0x0;
  }
  else {
    uVar4 = pUVar1->count / 2;
    local_50 = pUVar1->elements;
  }
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar8;
  }
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    c_00 = local_50[uVar8 * 2 + 1];
    pNVar3 = Norms::getNormRef((this->super_Enumerator).norms,c_00);
    uVar7 = (uint)(pNVar3->compositions != (UVector32 *)0x0) + c_00 * 2;
    uVar6 = local_50[uVar8 * 2];
    if ((int)uVar6 < 0x3400) {
      cVar2 = (short)uVar6 * 2;
      if ((int)uVar7 < 0x10000) {
        uVar6 = uVar7;
        uVar7 = 0xffffffff;
      }
      else {
        cVar2 = cVar2 | 1;
        uVar6 = (uint)(c_00 * 2) >> 0x10;
      }
    }
    else {
      cVar2 = ((ushort)(uVar6 >> 9) | 1) + L'㐀';
      uVar6 = c_00 * 2 >> 0x10 | uVar6 << 6;
    }
    srcChar = cVar2 | 0x8000;
    if (uVar4 - 1 != uVar8) {
      srcChar = cVar2;
    }
    this_00 = UnicodeString::append(dataString,srcChar);
    UnicodeString::append(this_00,(char16_t)uVar6);
    if (-1 < (int)uVar7) {
      UnicodeString::append(dataString,(char16_t)uVar7);
    }
  }
  return;
}

Assistant:

void ExtraData::writeCompositions(UChar32 c, const Norm &norm, UnicodeString &dataString) {
    if(norm.cc!=0) {
        fprintf(stderr,
                "gennorm2 error: "
                "U+%04lX combines-forward and has ccc!=0, not possible in Unicode normalization\n",
                (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    int32_t length;
    const CompositionPair *pairs=norm.getCompositionPairs(length);
    for(int32_t i=0; i<length; ++i) {
        const CompositionPair &pair=pairs[i];
        // 22 bits for the composite character and whether it combines forward.
        UChar32 compositeAndFwd=pair.composite<<1;
        if(norms.getNormRef(pair.composite).compositions!=NULL) {
            compositeAndFwd|=1;  // The composite character also combines-forward.
        }
        // Encode most pairs in two units and some in three.
        int32_t firstUnit, secondUnit, thirdUnit;
        if(pair.trail<Normalizer2Impl::COMP_1_TRAIL_LIMIT) {
            if(compositeAndFwd<=0xffff) {
                firstUnit=pair.trail<<1;
                secondUnit=compositeAndFwd;
                thirdUnit=-1;
            } else {
                firstUnit=(pair.trail<<1)|Normalizer2Impl::COMP_1_TRIPLE;
                secondUnit=compositeAndFwd>>16;
                thirdUnit=compositeAndFwd;
            }
        } else {
            firstUnit=(Normalizer2Impl::COMP_1_TRAIL_LIMIT+
                       (pair.trail>>Normalizer2Impl::COMP_1_TRAIL_SHIFT))|
                      Normalizer2Impl::COMP_1_TRIPLE;
            secondUnit=(pair.trail<<Normalizer2Impl::COMP_2_TRAIL_SHIFT)|
                       (compositeAndFwd>>16);
            thirdUnit=compositeAndFwd;
        }
        // Set the high bit of the first unit if this is the last composition pair.
        if(i==(length-1)) {
            firstUnit|=Normalizer2Impl::COMP_1_LAST_TUPLE;
        }
        dataString.append((UChar)firstUnit).append((UChar)secondUnit);
        if(thirdUnit>=0) {
            dataString.append((UChar)thirdUnit);
        }
    }
}